

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,char (*val) [38])

{
  type pbVar1;
  char (*val_local) [38];
  Message *this_local;
  
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&this->ss_);
  std::operator<<((ostream *)(pbVar1 + 0x10),*val);
  return this;
}

Assistant:

inline Message& operator <<(const T& val) {
    // Some libraries overload << for STL containers.  These
    // overloads are defined in the global namespace instead of ::std.
    //
    // C++'s symbol lookup rule (i.e. Koenig lookup) says that these
    // overloads are visible in either the std namespace or the global
    // namespace, but not other namespaces, including the testing
    // namespace which Google Test's Message class is in.
    //
    // To allow STL containers (and other types that has a << operator
    // defined in the global namespace) to be used in Google Test
    // assertions, testing::Message must access the custom << operator
    // from the global namespace.  With this using declaration,
    // overloads of << defined in the global namespace and those
    // visible via Koenig lookup are both exposed in this function.
    using ::operator <<;
    *ss_ << val;
    return *this;
  }